

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_z.cpp
# Opt level: O0

void zaxpy(int n,complex<double> ca,complex<double> *cx,int incx,complex<double> *cy,int incy)

{
  complex<double> *pcVar1;
  undefined4 in_register_0000003c;
  double dVar2;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 uVar3;
  complex<double> z;
  complex<double> local_98 [2];
  complex<double> local_78 [3];
  int local_48;
  int local_44;
  int iy;
  int ix;
  int i;
  int incy_local;
  complex<double> *cy_local;
  long lStack_28;
  int incx_local;
  complex<double> *cx_local;
  undefined1 auStack_18 [4];
  int n_local;
  complex<double> ca_local;
  
  z._M_value._4_4_ = in_register_0000003c;
  z._M_value._0_4_ = n;
  z._M_value._8_8_ = ca._M_value._0_8_;
  cy_local._4_4_ = ca._M_value._8_4_;
  if (0 < n) {
    ix = incx;
    _i = cx;
    lStack_28 = z._M_value._8_8_;
    cx_local._4_4_ = n;
    dVar2 = zabs1(z);
    uVar3 = 0;
    if ((dVar2 != 0.0) || (NAN(dVar2))) {
      if ((cy_local._4_4_ == 1) && (ix == 1)) {
        for (iy = 0; iy < cx_local._4_4_; iy = iy + 1) {
          pcVar1 = _i + iy;
          std::operator*((complex<double> *)auStack_18,
                         (complex<double> *)(lStack_28 + (long)iy * 0x10));
          local_98[0]._M_value._8_8_ = uVar3;
          std::operator+(pcVar1,local_98);
          *(undefined8 *)_i[iy]._M_value = extraout_XMM0_Qa_00;
          *(undefined8 *)(_i[iy]._M_value + 8) = uVar3;
          local_98[1]._M_value._8_8_ = uVar3;
        }
      }
      else {
        if (cy_local._4_4_ < 0) {
          local_44 = (1 - cx_local._4_4_) * cy_local._4_4_;
        }
        else {
          local_44 = 0;
        }
        if (ix < 0) {
          local_48 = (1 - cx_local._4_4_) * ix;
        }
        else {
          local_48 = 0;
        }
        for (iy = 0; iy < cx_local._4_4_; iy = iy + 1) {
          pcVar1 = _i + local_48;
          std::operator*((complex<double> *)auStack_18,
                         (complex<double> *)(lStack_28 + (long)local_44 * 0x10));
          local_78[0]._M_value._8_8_ = uVar3;
          std::operator+(pcVar1,local_78);
          *(undefined8 *)_i[local_48]._M_value = extraout_XMM0_Qa;
          *(undefined8 *)(_i[local_48]._M_value + 8) = uVar3;
          local_44 = local_44 + cy_local._4_4_;
          local_48 = local_48 + ix;
          local_78[1]._M_value._8_8_ = uVar3;
        }
      }
    }
  }
  return;
}

Assistant:

void zaxpy ( int n, complex <double> ca, complex <double> cx[],
  int incx, complex <double> cy[], int incy )

//****************************************************************************80
//
//  Purpose:
//
//    ZAXPY adds a multiple of one complex <double> vector to another.
//
//  Discussion:
//
//    This routine uses double precision complex arithmetic.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 April 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Cleve Moler, Jim Bunch, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of elements in CX and CY.
//
//    Input, complex <double> CA, the multiplier of CX.
//
//    Input, complex <double> CX[], the first vector.
//
//    Input, int INCX, the increment between successive entries of CX.
//
//    Input/output, complex <double> CY[], the second vector.
//    On output, CY(*) has been replaced by CY(*) + CA * CX(*).
//
//    Input, int INCY, the increment between successive entries of CY.
//
{
  int i;
  int ix;
  int iy;

  if ( n <= 0 )
  {
    return;
  }

  if ( zabs1 ( ca ) == 0.0 )
  {
    return;
  }

  if ( incx != 1 || incy != 1 )
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( -n + 1 ) * incx;
    }

    if ( 0 <= incy )
    {
      iy = 0;
    }
    else
    {
      iy = ( -n + 1 ) * incy;
    }

    for ( i = 0; i < n; i++ )
    {
      cy[iy] = cy[iy] + ca * cx[ix];
      ix = ix + incx;
      iy = iy + incy;
    }
  }
  else
  {
    for ( i = 0; i < n; i++ )
    {
      cy[i] = cy[i] + ca * cx[i];
    }

  }

  return;
}